

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightLeSample> * __thiscall
pbrt::DiffuseAreaLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,DiffuseAreaLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  ulong uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  undefined1 auVar10 [16];
  Normal3f n;
  uint uVar11;
  Sphere *this_00;
  Curve *this_01;
  float fVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar13;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  float fVar24;
  undefined8 in_XMM1_Qb;
  undefined1 auVar26 [56];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  SampledSpectrum SVar39;
  Point3f p;
  Vector3f w;
  optional<pbrt::ShapeSample> ss;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_1a8;
  char local_150;
  SampledSpectrum local_140;
  Tuple3<pbrt::Vector3,_float> local_130;
  anon_struct_8_0_00000001_for___align local_120;
  float afStack_118 [2];
  Tuple3<pbrt::Point3,_float> local_110;
  float fStack_104;
  float fStack_100;
  undefined8 uStack_fc;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_f0;
  aligned_storage_t<sizeof(pbrt::Interaction),_alignof(pbrt::Interaction)> local_e8;
  bool local_98;
  undefined8 local_90;
  RayDifferential local_88;
  undefined1 auVar23 [56];
  undefined1 auVar25 [64];
  
  uVar1 = (this->shape).
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          .bits;
  uVar11 = (uint)(ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x32 == 0) {
    this_00 = (Sphere *)(uVar1 & 0xffffffffffff);
    if (uVar1 >> 0x31 == 0) {
      Sphere::Sample((optional<pbrt::ShapeSample> *)&local_1a8.__align,this_00,u1);
    }
    else if (uVar11 == 2) {
      Cylinder::Sample((optional<pbrt::ShapeSample> *)&local_1a8.__align,(Cylinder *)this_00,u1);
    }
    else {
      Disk::Sample((optional<pbrt::ShapeSample> *)&local_1a8.__align,(Disk *)this_00,u1);
    }
  }
  else {
    uVar11 = uVar11 - 3;
    this_01 = (Curve *)(uVar1 & 0xffffffffffff);
    if (uVar11 < 2) {
      Triangle::Sample((optional<pbrt::ShapeSample> *)&local_1a8.__align,(Triangle *)this_01,u1);
    }
    else if (uVar11 == 2) {
      BilinearPatch::Sample
                ((optional<pbrt::ShapeSample> *)&local_1a8.__align,(BilinearPatch *)this_01,u1);
    }
    else {
      Curve::Sample((optional<pbrt::ShapeSample> *)&local_1a8.__align,this_01,u1);
    }
  }
  if (local_150 == '\0') goto LAB_0034d988;
  local_1a8._64_8_ = &(this->super_LightBase).mediumInterface;
  local_1c8 = u2.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_1c4 = u2.super_Tuple2<pbrt::Point2,_float>.y;
  fStack_1c0 = (float)in_XMM1_Qb;
  fStack_1bc = (float)((ulong)in_XMM1_Qb >> 0x20);
  local_1a8._24_4_ = time;
  if (this->twoSided == true) {
    if (0.5 <= local_1c8) {
      auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(local_1c8 + -0.5 + local_1c8 + -0.5)));
      auVar20._0_4_ = auVar17._0_4_ + auVar17._0_4_;
      auVar20._4_4_ = fStack_1c4 + fStack_1c4;
      auVar20._8_4_ = fStack_1c0 + fStack_1c0;
      auVar20._12_4_ = fStack_1bc + fStack_1bc;
      auVar16._8_4_ = 0xbf800000;
      auVar16._0_8_ = 0xbf800000bf800000;
      auVar16._12_4_ = 0xbf800000;
      auVar14 = vaddps_avx512vl(auVar20,auVar16);
      fVar13 = auVar14._0_4_;
      auVar17 = vmovshdup_avx(auVar14);
      fVar18 = auVar17._0_4_;
      if ((fVar13 != 0.0) || (NAN(fVar13))) {
LAB_0034d8b7:
        auVar7._8_4_ = 0x7fffffff;
        auVar7._0_8_ = 0x7fffffff7fffffff;
        auVar7._12_4_ = 0x7fffffff;
        auVar15 = vandps_avx512vl(auVar14,auVar7);
        auVar17 = vshufps_avx(auVar15,auVar15,0xf5);
        auVar30._0_4_ = fVar13 / fVar18;
        auVar30._4_12_ = auVar14._4_12_;
        bVar9 = auVar17._0_4_ < auVar15._0_4_;
        auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar30,ZEXT416(0x3fc90fdb));
        fVar12 = (float)((uint)bVar9 * (int)((fVar18 / fVar13) * 0.7853982) +
                        (uint)!bVar9 * auVar17._0_4_);
        fVar13 = (float)((uint)bVar9 * (int)fVar13 + (uint)!bVar9 * (int)fVar18);
        fVar18 = cosf(fVar12);
        fVar12 = sinf(fVar12);
        auVar17 = vinsertps_avx(ZEXT416((uint)(fVar13 * fVar18)),ZEXT416((uint)(fVar13 * fVar12)),
                                0x10);
      }
      else {
        auVar17 = ZEXT416(0) << 0x20;
        if ((fVar18 != 0.0) || (NAN(fVar18))) goto LAB_0034d8b7;
      }
      auVar14 = vmovshdup_avx(auVar17);
      auVar15 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar17,auVar17);
      auVar14 = vfnmadd213ss_fma(auVar14,auVar14,auVar15);
      auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x20);
      auVar14 = vsqrtss_avx(auVar14,auVar14);
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar14 = vxorps_avx512vl(auVar14,auVar8);
    }
    else {
      auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(local_1c8 + local_1c8)));
      auVar19._0_4_ = auVar17._0_4_ + auVar17._0_4_;
      auVar19._4_4_ = fStack_1c4 + fStack_1c4;
      auVar19._8_4_ = fStack_1c0 + fStack_1c0;
      auVar19._12_4_ = fStack_1bc + fStack_1bc;
      auVar3._8_4_ = 0xbf800000;
      auVar3._0_8_ = 0xbf800000bf800000;
      auVar3._12_4_ = 0xbf800000;
      auVar14 = vaddps_avx512vl(auVar19,auVar3);
      fVar13 = auVar14._0_4_;
      auVar17 = vmovshdup_avx(auVar14);
      fVar18 = auVar17._0_4_;
      if ((fVar13 != 0.0) || (NAN(fVar13))) {
LAB_0034d6ed:
        auVar4._8_4_ = 0x7fffffff;
        auVar4._0_8_ = 0x7fffffff7fffffff;
        auVar4._12_4_ = 0x7fffffff;
        auVar15 = vandps_avx512vl(auVar14,auVar4);
        auVar17 = vshufps_avx(auVar15,auVar15,0xf5);
        auVar28._0_4_ = fVar13 / fVar18;
        auVar28._4_12_ = auVar14._4_12_;
        bVar9 = auVar17._0_4_ < auVar15._0_4_;
        auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar28,ZEXT416(0x3fc90fdb));
        fVar12 = (float)((uint)bVar9 * (int)((fVar18 / fVar13) * 0.7853982) +
                        (uint)!bVar9 * auVar17._0_4_);
        fVar13 = (float)((uint)bVar9 * (int)fVar13 + (uint)!bVar9 * (int)fVar18);
        fVar18 = cosf(fVar12);
        fVar12 = sinf(fVar12);
        auVar17 = vinsertps_avx(ZEXT416((uint)(fVar13 * fVar18)),ZEXT416((uint)(fVar13 * fVar12)),
                                0x10);
      }
      else {
        auVar17 = ZEXT416(0) << 0x20;
        if ((fVar18 != 0.0) || (NAN(fVar18))) goto LAB_0034d6ed;
      }
      auVar14 = vmovshdup_avx(auVar17);
      auVar15 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar17,auVar17);
      auVar14 = vfnmadd213ss_fma(auVar14,auVar14,auVar15);
      auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x20);
      auVar14 = vsqrtss_avx(auVar14,auVar14);
    }
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar15 = vandps_avx512vl(auVar14,auVar5);
    fVar13 = auVar15._0_4_ * 0.31830987 * 0.5;
  }
  else {
    auVar14._0_4_ = local_1c8 + local_1c8;
    auVar14._4_4_ = fStack_1c4 + fStack_1c4;
    auVar14._8_4_ = fStack_1c0 + fStack_1c0;
    auVar14._12_4_ = fStack_1bc + fStack_1bc;
    auVar17._8_4_ = 0xbf800000;
    auVar17._0_8_ = 0xbf800000bf800000;
    auVar17._12_4_ = 0xbf800000;
    auVar14 = vaddps_avx512vl(auVar14,auVar17);
    fVar13 = auVar14._0_4_;
    auVar17 = vmovshdup_avx(auVar14);
    fVar18 = auVar17._0_4_;
    if (fVar13 == 0.0) {
      auVar17 = ZEXT416(0) << 0x20;
      if ((fVar18 != 0.0) || (NAN(fVar18))) goto LAB_0034d7c3;
    }
    else {
LAB_0034d7c3:
      auVar15._8_4_ = 0x7fffffff;
      auVar15._0_8_ = 0x7fffffff7fffffff;
      auVar15._12_4_ = 0x7fffffff;
      auVar15 = vandps_avx512vl(auVar14,auVar15);
      auVar17 = vshufps_avx(auVar15,auVar15,0xf5);
      auVar29._0_4_ = fVar13 / fVar18;
      auVar29._4_12_ = auVar14._4_12_;
      bVar9 = auVar17._0_4_ < auVar15._0_4_;
      auVar17 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar29,ZEXT416(0x3fc90fdb));
      fVar12 = (float)((uint)bVar9 * (int)((fVar18 / fVar13) * 0.7853982) +
                      (uint)!bVar9 * auVar17._0_4_);
      fVar13 = (float)((uint)bVar9 * (int)fVar13 + (uint)!bVar9 * (int)fVar18);
      fVar18 = cosf(fVar12);
      fVar12 = sinf(fVar12);
      auVar17 = vinsertps_avx(ZEXT416((uint)(fVar13 * fVar18)),ZEXT416((uint)(fVar13 * fVar12)),0x10
                             );
    }
    auVar14 = vmovshdup_avx(auVar17);
    auVar15 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar17,auVar17);
    auVar14 = vfnmadd213ss_fma(auVar14,auVar14,auVar15);
    auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x20);
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar13 = auVar14._0_4_ * 0.31830987;
  }
  if ((fVar13 != 0.0) || (NAN(fVar13))) {
    if (local_150 != '\0') {
      auVar32._8_4_ = 0x80000000;
      auVar32._0_8_ = 0x8000000080000000;
      auVar32._12_4_ = 0x80000000;
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = 0x3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar38._8_4_ = 0x3f800000;
      auVar38._0_8_ = 0x3f8000003f800000;
      auVar38._12_4_ = 0x3f800000;
      n.super_Tuple3<pbrt::Normal3,_float>.z = (float)local_1a8._48_4_;
      n.super_Tuple3<pbrt::Normal3,_float>.x = (float)local_1a8._40_4_;
      n.super_Tuple3<pbrt::Normal3,_float>.y = (float)local_1a8._44_4_;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_1a8._40_8_;
      auVar16 = vpternlogd_avx512vl(auVar34,ZEXT416((uint)local_1a8._48_4_),auVar32,0xf8);
      fVar33 = auVar16._0_4_;
      fVar27 = (float)local_1a8._40_8_;
      auVar36._0_4_ = -1.0 / ((float)local_1a8._48_4_ + fVar33);
      auVar15 = vmovshdup_avx(auVar31);
      auVar37._0_4_ = fVar27 * fVar33 * fVar27;
      fVar12 = (float)((ulong)local_1a8._40_8_ >> 0x20);
      auVar37._4_4_ = fVar12 * 0.0;
      auVar37._8_8_ = 0;
      fVar18 = auVar17._0_4_;
      auVar35._0_4_ = fVar27 * fVar18;
      auVar35._4_4_ = fVar12 * auVar17._4_4_;
      auVar35._8_4_ = auVar17._8_4_ * 0.0;
      auVar35._12_4_ = auVar17._12_4_ * 0.0;
      auVar29 = vmovshdup_avx(auVar35);
      fVar24 = auVar14._0_4_;
      local_130.z = (float)local_1a8._48_4_ * fVar24 + (fVar18 * fVar27 * -fVar33 - auVar29._0_4_);
      fVar2 = fVar27 * auVar15._0_4_ * auVar36._0_4_;
      auVar36._4_4_ = auVar36._0_4_;
      auVar36._8_4_ = auVar36._0_4_;
      auVar36._12_4_ = auVar36._0_4_;
      auVar14 = vunpcklps_avx(auVar38,auVar16);
      auVar29 = vfmadd231ps_fma(auVar14,auVar37,auVar36);
      auVar16 = vpermi2ps_avx512vl(_DAT_0054e630,ZEXT416((uint)(fVar33 * fVar2)),
                                   ZEXT416((uint)fVar2));
      auVar15 = vshufps_avx(auVar17,auVar17,0xe1);
      fVar18 = fVar27 * fVar24 + fVar18 * auVar29._0_4_ + auVar16._0_4_ * auVar15._0_4_;
      fVar12 = fVar12 * fVar24 + auVar17._4_4_ * auVar29._4_4_ + auVar16._4_4_ * auVar15._4_4_;
      auVar10._4_8_ = local_1a8._4_8_;
      auVar10._0_4_ = local_1a8._0_4_;
      auVar10._12_4_ = local_1a8._12_4_;
      auVar14 = vinsertps_avx(auVar10,ZEXT416((uint)local_1a8._12_4_),0x10);
      local_130._0_8_ =
           vmovlps_avx(CONCAT412(fVar24 * 0.0 +
                                 auVar17._12_4_ * auVar29._12_4_ + auVar16._12_4_ * auVar15._12_4_,
                                 CONCAT48(fVar24 * 0.0 +
                                          auVar17._8_4_ * auVar29._8_4_ +
                                          auVar16._8_4_ * auVar15._8_4_,CONCAT44(fVar12,fVar18))));
      auVar21._0_4_ = (float)local_1a8._4_8_ + auVar14._0_4_;
      auVar21._4_4_ = (float)((ulong)local_1a8._4_8_ >> 0x20) + auVar14._4_4_;
      auVar21._8_4_ = auVar14._8_4_ + 0.0;
      auVar21._12_4_ = auVar14._12_4_ + 0.0;
      auVar6._8_4_ = 0x3f000000;
      auVar6._0_8_ = 0x3f0000003f000000;
      auVar6._12_4_ = 0x3f000000;
      auVar17 = vmulps_avx512vl(auVar21,auVar6);
      p.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar17._0_8_;
      p.super_Tuple3<pbrt::Point3,_float>.z =
           ((float)local_1a8._16_4_ + (float)local_1a8._20_4_) * 0.5;
      auVar26 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      auVar23 = ZEXT856(auVar17._8_8_);
      w.super_Tuple3<pbrt::Vector3,_float>.z = local_130.z;
      w.super_Tuple3<pbrt::Vector3,_float>.x = fVar18;
      w.super_Tuple3<pbrt::Vector3,_float>.y = fVar12;
      SVar39 = L(this,p,n,(Point2f)local_1a8._52_8_,w,lambda);
      auVar25._0_8_ = SVar39.values.values._8_8_;
      auVar25._8_56_ = auVar26;
      auVar22._0_8_ = SVar39.values.values._0_8_;
      auVar22._8_56_ = auVar23;
      local_140.values.values = (array<float,_4>)vmovlhps_avx(auVar22._0_16_,auVar25._0_16_);
      Interaction::SpawnRay(&local_88,(Interaction *)&local_1a8.__align,(Vector3f *)&local_130);
      if (local_150 != '\0') {
        LightLeSample::LightLeSample
                  ((LightLeSample *)&local_120,&local_140,&local_88.super_Ray,
                   (Interaction *)&local_1a8.__align,(Float)local_1a8._80_4_,fVar13);
        __return_storage_ptr__->set = true;
        (__return_storage_ptr__->optionalValue).__align = local_120;
        *(float (*) [2])((long)&__return_storage_ptr__->optionalValue + 8) = afStack_118;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_110._0_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
             CONCAT44(fStack_104,local_110.z);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x1c) =
             CONCAT44(fStack_100,fStack_104);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = uStack_fc;
        ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          *)((long)&__return_storage_ptr__->optionalValue + 0x30))->bits = local_f0.bits;
        (__return_storage_ptr__->optionalValue).__data[0x88] = local_98;
        if (local_98 == true) {
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = local_e8._64_8_;
          *(anon_struct_8_0_00000001_for___align *)
           ((long)&__return_storage_ptr__->optionalValue + 0x38) = local_e8.__align;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_e8._8_8_;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_e8._16_8_;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_e8._24_8_;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_e8._32_8_;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = local_e8._40_8_;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = local_e8._48_8_;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = local_e8._56_8_;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = local_e8._72_8_;
        }
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = local_90;
        return __return_storage_ptr__;
      }
    }
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
  }
LAB_0034d988:
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> DiffuseAreaLight::SampleLe(Point2f u1, Point2f u2,
                                                         SampledWavelengths &lambda,
                                                         Float time) const {
    // Sample a point on the area light's _Shape_
    pstd::optional<ShapeSample> ss = shape.Sample(u1);
    if (!ss)
        return {};
    ss->intr.time = time;
    ss->intr.mediumInterface = &mediumInterface;

    // Sample a cosine-weighted outgoing direction _w_ for area light
    Vector3f w;
    Float pdfDir;
    if (twoSided) {
        // Choose side of surface and sample cosine-weighted outgoing direction
        if (u2[0] < 0.5f) {
            u2[0] = std::min(u2[0] * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u2);
        } else {
            u2[0] = std::min((u2[0] - 0.5f) * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u2);
            w.z *= -1;
        }
        pdfDir = 0.5f * CosineHemispherePDF(std::abs(w.z));

    } else {
        w = SampleCosineHemisphere(u2);
        pdfDir = CosineHemispherePDF(w.z);
    }
    if (pdfDir == 0)
        return {};

    // Return _LightLeSample_ for ray leaving area light
    const Interaction &intr = ss->intr;
    Frame nFrame = Frame::FromZ(intr.n);
    w = nFrame.FromLocal(w);
    return LightLeSample(L(intr.p(), intr.n, intr.uv, w, lambda), intr.SpawnRay(w), intr,
                         ss->pdf, pdfDir);
}